

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

void __thiscall ConstantAccel::Print(ConstantAccel *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *out_local;
  ConstantAccel *this_local;
  
  poVar1 = std::operator<<(out,"ConstantAccel: a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MotionBase).accel);
  poVar1 = std::operator<<(poVar1,", pf = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MotionBase).pf);
  poVar1 = std::operator<<(poVar1,", vf = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MotionBase).vf);
  poVar1 = std::operator<<(poVar1,", tf = ");
  this_00 = (void *)std::ostream::operator<<(poVar1,(this->super_MotionBase).tf);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "ConstantAccel: a = " << accel << ", pf = " << pf << ", vf = " << vf << ", tf = " << tf << std::endl; }